

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcopy.cpp
# Opt level: O2

int main(void)

{
  Am_Style aAStack_28 [8];
  Am_Style local_20 [8];
  Am_Style local_18 [8];
  
  init_windows();
  init_point_lists();
  Am_Style::Am_Style(local_18,(Am_Style *)&black);
  draw_point_lists(local_18);
  Am_Style::~Am_Style(local_18);
  puts("Hit RETURN to apply change to point-list in D2: ");
  getchar();
  Am_Style::Am_Style(local_20,(Am_Style *)&white);
  draw_point_lists(local_20);
  Am_Style::~Am_Style(local_20);
  change_left_point_lists();
  Am_Style::Am_Style(aAStack_28,(Am_Style *)&black);
  draw_point_lists(aAStack_28);
  Am_Style::~Am_Style(aAStack_28);
  puts("Hit RETURN to exit: ");
  getchar();
  return 0;
}

Assistant:

int
main()
{
  init_windows();
  init_point_lists();
  draw_point_lists(black);

  printf("Hit RETURN to apply change to point-list in D2: \n");
  getchar();

  draw_point_lists(white);
  change_left_point_lists();
  draw_point_lists(black);

  //
  // Exit
  //
  printf("Hit RETURN to exit: \n");
  getchar();

  return 0;
}